

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  xmlParserInputBufferPtr input;
  setDocumentLocatorSAXFunc p_Var4;
  startDocumentSAXFunc p_Var5;
  endElementSAXFunc p_Var6;
  __int32_t *p_Var7;
  xmlChar *pxVar8;
  endDocumentSAXFunc p_Var9;
  xmlChar xVar10;
  int iVar11;
  xmlParserInputState xVar12;
  uint uVar13;
  int iVar14;
  size_t sVar15;
  byte *pbVar16;
  xmlSAXLocator *pxVar17;
  __int32_t **pp_Var18;
  _xmlSAXHandler *p_Var19;
  charactersSAXFunc p_Var20;
  xmlDtdPtr pxVar21;
  xmlChar *pxVar22;
  char *pcVar23;
  byte bVar24;
  xmlParserErrors error;
  undefined8 in_R8;
  xmlChar *pxVar25;
  xmlParserInputPtr pxVar26;
  long lVar27;
  bool bVar28;
  byte bVar29;
  bool bVar30;
  htmlParserNodeInfo node_info;
  ushort local_64;
  byte local_62;
  byte local_61;
  void *local_60;
  htmlParserNodeInfo local_58;
  
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (pxVar26 = ctxt->input, pxVar26 == (xmlParserInputPtr)0x0)
     ) {
    pcVar23 = "htmlParseChunk: context error\n";
    iVar11 = 1;
    error = XML_ERR_INTERNAL_ERROR;
LAB_0014d871:
    htmlParseErr(ctxt,error,pcVar23,(xmlChar *)0x0,(xmlChar *)0x0);
    return iVar11;
  }
  if (((chunk == (char *)0x0 || size < 1) || (pxVar26->buf == (xmlParserInputBufferPtr)0x0)) ||
     (ctxt->instate == XML_PARSER_EOF)) {
    if (((ctxt->instate != XML_PARSER_EOF) &&
        (input = pxVar26->buf, input != (xmlParserInputBufferPtr)0x0)) &&
       ((input->encoder != (xmlCharEncodingHandlerPtr)0x0 &&
        ((input->buffer != (xmlBufPtr)0x0 && (input->raw != (xmlBufPtr)0x0)))))) {
      sVar15 = xmlBufGetInputBase(input->buffer,pxVar26);
      pxVar25 = ctxt->input->cur;
      pxVar22 = ctxt->input->base;
      iVar11 = xmlCharEncInput(input,terminate);
      xmlBufSetInputBaseCur(input->buffer,ctxt->input,sVar15,(long)pxVar25 - (long)pxVar22);
      if (iVar11 < 0) {
        pcVar23 = "encoder error\n";
        iVar11 = 0x51;
        error = XML_ERR_INVALID_ENCODING;
        goto LAB_0014d871;
      }
    }
  }
  else {
    sVar15 = xmlBufGetInputBase(pxVar26->buf->buffer,pxVar26);
    pxVar26 = ctxt->input;
    pxVar25 = pxVar26->cur;
    pxVar22 = pxVar26->base;
    iVar11 = xmlParserInputBufferPush(pxVar26->buf,size,chunk);
    xmlBufSetInputBaseCur(ctxt->input->buf->buffer,ctxt->input,sVar15,(long)pxVar25 - (long)pxVar22)
    ;
    if (iVar11 < 0) {
      ctxt->errNo = -1;
      ctxt->disableSAX = 1;
      return -1;
    }
  }
  pxVar26 = ctxt->input;
  if (pxVar26 == (xmlParserInputPtr)0x0) {
    bVar30 = true;
    goto LAB_0014e6aa;
  }
LAB_0014d8f9:
  if (pxVar26->buf == (xmlParserInputBufferPtr)0x0) {
    sVar15 = (size_t)pxVar26->length;
  }
  else {
    sVar15 = xmlBufUse(pxVar26->buf->buffer);
  }
  pxVar25 = pxVar26->base + (sVar15 - (long)pxVar26->cur);
  if ((((terminate != 0) && (pxVar25 == (xmlChar *)0x0)) &&
      (htmlAutoCloseOnEnd(ctxt), ctxt->nameNr == 0)) && (ctxt->instate != XML_PARSER_EOF)) {
    ctxt->instate = XML_PARSER_EOF;
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
      (*p_Var9)(ctxt->userData);
    }
  }
  pxVar22 = pxVar25;
  if ((long)pxVar25 < 1) goto switchD_0014d96b_caseD_ffffffff;
  pbVar16 = pxVar26->cur;
  if (*pbVar16 == 0) {
    pxVar26 = ctxt->input;
    ppxVar1 = &pxVar26->cur;
    *ppxVar1 = *ppxVar1 + 1;
    piVar2 = &pxVar26->col;
    *piVar2 = *piVar2 + 1;
    goto LAB_0014dcc1;
  }
  if (0x11 < (uint)(ctxt->instate + XML_PARSER_MISC)) goto LAB_0014dcc1;
  uVar13 = (uint)*pbVar16;
  pxVar22 = &DAT_00000001;
  switch(ctxt->instate) {
  case XML_PARSER_START:
    if ((uVar13 < 0x21) && ((0x100002600U >> ((ulong)uVar13 & 0x3f) & 1) != 0)) {
      htmlSkipBlankChars(ctxt);
      if (pxVar26->buf == (xmlParserInputBufferPtr)0x0) {
        sVar15 = (size_t)pxVar26->length;
      }
      else {
        sVar15 = xmlBufUse(pxVar26->buf->buffer);
      }
      pxVar25 = pxVar26->base + (sVar15 - (long)pxVar26->cur);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var4 = ctxt->sax->setDocumentLocator, p_Var4 != (setDocumentLocatorSAXFunc)0x0)) {
      local_60 = ctxt->userData;
      pxVar17 = __xmlDefaultSAXLocator();
      (*p_Var4)(local_60,pxVar17);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var5 = ctxt->sax->startDocument, p_Var5 != (startDocumentSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var5)(ctxt->userData);
    }
    if ((*pxVar26->cur == '<') && (pxVar26->cur[1] == '!')) {
      pp_Var18 = __ctype_toupper_loc();
      p_Var7 = *pp_Var18;
      pxVar22 = ctxt->input->cur;
      if ((((p_Var7[pxVar22[2]] != 0x44) ||
           ((p_Var7[pxVar22[3]] != 0x4f || (p_Var7[pxVar22[4]] != 0x43)))) ||
          (p_Var7[pxVar22[5]] != 0x54)) ||
         (((p_Var7[pxVar22[6]] != 0x59 || (p_Var7[pxVar22[7]] != 0x50)) ||
          (p_Var7[pxVar22[8]] != 0x45)))) goto LAB_0014e0ae;
      if (terminate == 0) {
        iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8);
        pxVar22 = pxVar25;
joined_r0x0014de22:
        if (iVar11 < 0) goto switchD_0014d96b_caseD_ffffffff;
      }
LAB_0014e0a1:
      htmlParseDocTypeDecl(ctxt);
      goto LAB_0014dec5;
    }
    goto LAB_0014e0ae;
  case XML_PARSER_MISC:
    htmlSkipBlankChars(ctxt);
    if (pxVar26->buf == (xmlParserInputBufferPtr)0x0) {
      sVar15 = (size_t)pxVar26->length;
    }
    else {
      sVar15 = xmlBufUse(pxVar26->buf->buffer);
    }
    pxVar25 = pxVar26->base + (sVar15 - (long)pxVar26->cur);
    pxVar22 = pxVar25;
    if ((long)pxVar25 < 1) goto switchD_0014d96b_caseD_ffffffff;
    if (pxVar25 == &DAT_00000001) {
      xVar10 = ' ';
      pxVar22 = &DAT_00000001;
      if (terminate == 0) goto switchD_0014d96b_caseD_ffffffff;
    }
    else {
      xVar10 = pxVar26->cur[1];
    }
    pxVar22 = pxVar26->cur;
    bVar30 = *pxVar22 != '<';
    bVar28 = xVar10 != '!';
    if (((bVar28 || bVar30) || (pxVar22[2] != '-')) || (pxVar22[3] != '-')) {
      if ((*pxVar22 != '<') || (xVar10 != '?')) {
        if (!bVar28 && !bVar30) {
          pp_Var18 = __ctype_toupper_loc();
          p_Var7 = *pp_Var18;
          pxVar22 = ctxt->input->cur;
          if (((p_Var7[pxVar22[2]] == 0x44) && (p_Var7[pxVar22[3]] == 0x4f)) &&
             ((p_Var7[pxVar22[4]] == 0x43 &&
              ((((p_Var7[pxVar22[5]] == 0x54 && (p_Var7[pxVar22[6]] == 0x59)) &&
                (p_Var7[pxVar22[7]] == 0x50)) && (p_Var7[pxVar22[8]] == 0x45)))))) {
            if (terminate == 0) {
              iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8);
              pxVar22 = &DAT_00000001;
              goto joined_r0x0014de22;
            }
            goto LAB_0014e0a1;
          }
        }
        pxVar22 = &DAT_00000001;
        if (8 < (long)pxVar25 || (bVar28 || bVar30)) goto LAB_0014dee3;
        goto switchD_0014d96b_caseD_ffffffff;
      }
      if ((terminate == 0) &&
         (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), pxVar22 = &DAT_00000001,
         iVar11 < 0)) goto switchD_0014d96b_caseD_ffffffff;
      htmlParsePI(ctxt);
    }
    else {
      if ((terminate == 0) &&
         (iVar11 = htmlParseLookupCommentEnd(ctxt), pxVar22 = &DAT_00000001, iVar11 < 0))
      goto switchD_0014d96b_caseD_ffffffff;
      htmlParseComment(ctxt);
    }
LAB_0014e0ae:
    ctxt->instate = XML_PARSER_MISC;
    goto LAB_0014dcc1;
  case XML_PARSER_PI:
    pcVar23 = "HPP: internal error, state == PI\n";
    break;
  case XML_PARSER_DTD:
    pcVar23 = "HPP: internal error, state == DTD\n";
    break;
  case XML_PARSER_PROLOG:
    htmlSkipBlankChars(ctxt);
    if (pxVar26->buf == (xmlParserInputBufferPtr)0x0) {
      sVar15 = (size_t)pxVar26->length;
    }
    else {
      sVar15 = xmlBufUse(pxVar26->buf->buffer);
    }
    pxVar25 = pxVar26->base + (sVar15 - (long)pxVar26->cur);
    pxVar22 = pxVar25;
    if (1 < (long)pxVar25) {
      pbVar16 = pxVar26->cur;
      bVar3 = pbVar16[1];
      bVar29 = *pbVar16 ^ 0x3c;
      if (((bVar3 != 0x21 || bVar29 != 0) || (pbVar16[2] != 0x2d)) || (pbVar16[3] != 0x2d)) {
        if (bVar29 != 0 || bVar3 != 0x3f) {
          pxVar22 = &DAT_00000001;
          if (3 < (long)pxVar25 || (bVar3 != 0x21 || bVar29 != 0)) goto LAB_0014dee3;
          goto switchD_0014d96b_caseD_ffffffff;
        }
        if ((terminate == 0) &&
           (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), pxVar22 = &DAT_00000001
           , iVar11 < 0)) goto switchD_0014d96b_caseD_ffffffff;
        htmlParsePI(ctxt);
      }
      else {
        if ((terminate == 0) &&
           (iVar11 = htmlParseLookupCommentEnd(ctxt), pxVar22 = &DAT_00000001, iVar11 < 0))
        goto switchD_0014d96b_caseD_ffffffff;
        htmlParseComment(ctxt);
      }
LAB_0014dec5:
      ctxt->instate = XML_PARSER_PROLOG;
      goto LAB_0014dcc1;
    }
    goto switchD_0014d96b_caseD_ffffffff;
  case XML_PARSER_COMMENT:
    pcVar23 = "HPP: internal error, state == COMMENT\n";
    break;
  case XML_PARSER_START_TAG:
    if (pxVar25 == &DAT_00000001) {
      if (terminate == 0) goto switchD_0014d96b_caseD_ffffffff;
      bVar30 = false;
    }
    else {
      bVar30 = pbVar16[1] == 0x2f;
    }
    if (uVar13 == 0x3c) {
      if (bVar30) {
        ctxt->instate = XML_PARSER_END_TAG;
        goto LAB_0014dcb6;
      }
      if ((terminate == 0) &&
         (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), iVar11 < 0))
      goto switchD_0014d96b_caseD_ffffffff;
      if (ctxt->record_info != 0) {
        pxVar26 = ctxt->input;
        local_58.begin_pos =
             (unsigned_long)(pxVar26->cur + (pxVar26->consumed - (long)pxVar26->base));
        local_58.begin_line = (unsigned_long)pxVar26->line;
      }
      iVar11 = htmlParseStartTag(ctxt);
      pxVar22 = ctxt->name;
      if (pxVar22 == (xmlChar *)0x0 || iVar11 == -1) {
        if (*ctxt->input->cur == '>') {
          xmlNextChar(ctxt);
        }
        goto LAB_0014dcc1;
      }
      lVar27 = 0;
      do {
        iVar11 = xmlStrcasecmp(pxVar22,*(xmlChar **)((long)&html40ElementTable[0].name + lVar27));
        if (iVar11 == 0) {
          lVar27 = (long)&html40ElementTable[0].name + lVar27;
          goto LAB_0014e1bc;
        }
        lVar27 = lVar27 + 0x40;
      } while (lVar27 != 0x1700);
      lVar27 = 0;
LAB_0014e1bc:
      if (lVar27 == 0) {
        in_R8 = 0;
        htmlParseErr(ctxt,XML_HTML_UNKNOWN_TAG,"Tag %s invalid\n",pxVar22,(xmlChar *)0x0);
      }
      pxVar26 = ctxt->input;
      pxVar8 = pxVar26->cur;
      if (*pxVar8 == '>') {
        xmlNextChar(ctxt);
        if ((lVar27 != 0) && (*(char *)(lVar27 + 0xb) != '\0')) {
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var6 = ctxt->sax->endElement, p_Var6 != (endElementSAXFunc)0x0)) {
            (*p_Var6)(ctxt->userData,pxVar22);
          }
LAB_0014e4fc:
          iVar11 = ctxt->nameNr;
          lVar27 = (long)iVar11;
          if (0 < lVar27) {
            ctxt->nameNr = iVar11 + -1;
            if (iVar11 == 1) {
              pxVar22 = (xmlChar *)0x0;
            }
            else {
              pxVar22 = ctxt->nameTab[lVar27 + -2];
            }
            ctxt->name = pxVar22;
            ctxt->nameTab[lVar27 + -1] = (xmlChar *)0x0;
          }
        }
      }
      else {
        if ((*pxVar8 == '/') && (pxVar8[1] == '>')) {
          pxVar26->cur = pxVar8 + 2;
          pxVar26->col = pxVar26->col + 2;
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var6 = ctxt->sax->endElement, p_Var6 != (endElementSAXFunc)0x0)) {
            (*p_Var6)(ctxt->userData,pxVar22);
          }
          iVar11 = ctxt->nameNr;
          lVar27 = (long)iVar11;
          if (0 < lVar27) {
            ctxt->nameNr = iVar11 + -1;
            if (iVar11 == 1) {
              pxVar22 = (xmlChar *)0x0;
            }
            else {
              pxVar22 = ctxt->nameTab[lVar27 + -2];
            }
            ctxt->name = pxVar22;
            ctxt->nameTab[lVar27 + -1] = (xmlChar *)0x0;
          }
          goto LAB_0014dee3;
        }
        in_R8 = 0;
        htmlParseErr(ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s\n",pxVar22,
                     (xmlChar *)0x0);
        iVar11 = xmlStrEqual(pxVar22,ctxt->name);
        if (iVar11 != 0) {
          nodePop(ctxt);
          goto LAB_0014e4fc;
        }
      }
      if (ctxt->record_info != 0) {
        htmlNodeInfoPush(ctxt,&local_58);
      }
    }
LAB_0014dee3:
    ctxt->instate = XML_PARSER_CONTENT;
    goto LAB_0014dcc1;
  case XML_PARSER_CONTENT:
    local_64 = 0;
    if (ctxt->token != 0) {
      local_64 = (ushort)(byte)ctxt->token;
      htmlCheckParagraph(ctxt);
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var20 = ctxt->sax->characters, p_Var20 != (charactersSAXFunc)0x0)) {
        (*p_Var20)(ctxt->userData,(xmlChar *)&local_64,1);
      }
      ctxt->token = 0;
      ctxt->checkIndex = 0;
    }
    if ((((terminate == 0) || (pxVar25 != &DAT_00000001)) || (bVar3 = *pxVar26->cur, bVar3 == 0x26))
       || (bVar3 == 0x3c)) {
      iVar11 = 4;
      if (pxVar25 != &DAT_00000001) {
        local_60 = (void *)CONCAT71(local_60._1_7_,*pxVar26->cur);
        bVar3 = pxVar26->cur[1];
        iVar11 = xmlStrEqual(ctxt->name,"script");
        if ((iVar11 == 0) && (iVar11 = xmlStrEqual(ctxt->name,"style"), iVar11 == 0)) {
          bVar24 = (byte)local_60 ^ 0x3c;
          bVar29 = bVar3 == 0x21 && bVar24 == 0;
          if (bVar3 == 0x21 && bVar24 == 0) {
            local_62 = bVar29;
            local_61 = bVar24;
            pp_Var18 = __ctype_toupper_loc();
            p_Var7 = *pp_Var18;
            pxVar8 = ctxt->input->cur;
            if (((p_Var7[pxVar8[2]] != 0x44) || (p_Var7[pxVar8[3]] != 0x4f)) ||
               ((p_Var7[pxVar8[4]] != 0x43 ||
                ((((p_Var7[pxVar8[5]] != 0x54 || (p_Var7[pxVar8[6]] != 0x59)) ||
                  (p_Var7[pxVar8[7]] != 0x50)) || (p_Var7[pxVar8[8]] != 0x45)))))) {
              bVar29 = local_62;
              bVar24 = local_61;
              if ((pxVar26->cur[2] != '-') || (pxVar26->cur[3] != '-')) goto LAB_0014e3c4;
              if (terminate == 0) {
                iVar14 = htmlParseLookupCommentEnd(ctxt);
                iVar11 = 4;
                if (iVar14 < 0) goto LAB_0014e47c;
              }
              htmlParseComment(ctxt);
              goto LAB_0014e3f7;
            }
            if (terminate == 0) {
              iVar14 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8);
              iVar11 = 4;
              if (iVar14 < 0) goto LAB_0014e47c;
            }
            in_R8 = 0;
            htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"Misplaced DOCTYPE declaration\n",
                         (xmlChar *)"DOCTYPE",(xmlChar *)0x0);
            htmlParseDocTypeDecl(ctxt);
          }
          else {
LAB_0014e3c4:
            if (bVar3 != 0x3f || bVar24 != 0) {
              iVar11 = 4;
              if (((long)pxVar25 < 4 & bVar29) == 0) {
                if (bVar24 == 0 && bVar3 == 0x2f) {
                  ctxt->instate = XML_PARSER_END_TAG;
LAB_0014e42a:
                  ctxt->checkIndex = 0;
                  goto LAB_0014e477;
                }
                if ((char)local_60 == '<') {
                  if ((terminate != 0) || (bVar3 != 0)) {
                    if ((0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) &&
                       ((0x31 < bVar3 - 0x2e ||
                        ((0x2000000001001U >> ((ulong)(bVar3 - 0x2e) & 0x3f) & 1) == 0)))) {
                      in_R8 = 0;
                      htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,
                                   "htmlParseTryOrFinish: invalid element name\n",(xmlChar *)0x0,
                                   (xmlChar *)0x0);
                      htmlCheckParagraph(ctxt);
                      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                         (p_Var20 = ctxt->sax->characters, p_Var20 != (charactersSAXFunc)0x0)) {
                        (*p_Var20)(ctxt->userData,pxVar26->cur,1);
                      }
                      xmlNextChar(ctxt);
                      goto LAB_0014e477;
                    }
                    ctxt->instate = XML_PARSER_START_TAG;
                    goto LAB_0014e42a;
                  }
                }
                else {
                  if (terminate == 0) {
                    iVar14 = htmlParseLookupSequence(ctxt,'<','\0','\0',(int)in_R8);
                    iVar11 = 4;
                    if (iVar14 < 0) goto LAB_0014e47c;
                  }
                  ctxt->checkIndex = 0;
                  do {
                    iVar11 = 5;
                    if (pxVar26->end <= pxVar26->cur) break;
                    if ((char)local_60 == '&') {
                      htmlParseReference(ctxt);
                    }
                    else {
                      htmlParseCharDataInternal(ctxt,0);
                    }
                    local_60 = (void *)CONCAT71(local_60._1_7_,*pxVar26->cur);
                    iVar11 = 5;
                  } while (*pxVar26->cur != '<');
                }
              }
              goto LAB_0014e47c;
            }
            if (terminate == 0) {
              iVar14 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8);
              iVar11 = 4;
              if (iVar14 < 0) goto LAB_0014e47c;
            }
            htmlParsePI(ctxt);
LAB_0014e3f7:
            ctxt->instate = XML_PARSER_CONTENT;
          }
          goto LAB_0014e477;
        }
        if (terminate == 0) {
          uVar13 = htmlParseLookupSequence(ctxt,'<','/','\0',(int)in_R8);
          if ((int)uVar13 < 0) {
            iVar11 = 4;
            bVar30 = false;
          }
          else {
            bVar28 = pxVar26->cur[(ulong)uVar13 + 2] == '\0';
            bVar30 = !bVar28;
            iVar11 = (uint)bVar28 << 2;
          }
          if (!bVar30) goto LAB_0014e47c;
        }
        htmlParseScript(ctxt);
        iVar11 = 5;
        if (bVar3 == 0x2f && (char)local_60 == '<') {
          ctxt->instate = XML_PARSER_END_TAG;
          ctxt->checkIndex = 0;
        }
      }
    }
    else {
      p_Var19 = ctxt->sax;
      if (p_Var19 != (_xmlSAXHandler *)0x0) {
        local_64 = CONCAT11(local_64._1_1_,bVar3);
        if ((bVar3 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0)) {
          if (ctxt->keepBlanks != 0) goto LAB_0014e442;
          p_Var20 = p_Var19->ignorableWhitespace;
        }
        else {
          htmlCheckParagraph(ctxt);
          p_Var19 = ctxt->sax;
LAB_0014e442:
          p_Var20 = p_Var19->characters;
        }
        if (p_Var20 != (charactersSAXFunc)0x0) {
          (*p_Var20)(ctxt->userData,(xmlChar *)&local_64,1);
        }
      }
      ctxt->token = 0;
      ctxt->checkIndex = 0;
      pxVar26->cur = pxVar26->cur + 1;
LAB_0014e477:
      iVar11 = 5;
    }
LAB_0014e47c:
    if (iVar11 == 5) goto LAB_0014dcc1;
    if (iVar11 != 4) goto LAB_0014e748;
    goto switchD_0014d96b_caseD_ffffffff;
  case XML_PARSER_CDATA_SECTION:
    pcVar23 = "HPP: internal error, state == CDATA\n";
    break;
  case XML_PARSER_END_TAG:
    if ((pxVar25 != &DAT_00000001) &&
       ((terminate != 0 ||
        (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar11)))) {
      htmlParseEndTag(ctxt);
      xVar12 = XML_PARSER_CONTENT;
      if (ctxt->nameNr == 0) {
        xVar12 = XML_PARSER_EPILOG;
      }
      ctxt->instate = xVar12;
      goto LAB_0014dcb6;
    }
    goto switchD_0014d96b_caseD_ffffffff;
  case XML_PARSER_ENTITY_DECL:
    pcVar23 = "HPP: internal error, state == ENTITY_DECL\n";
    break;
  case XML_PARSER_ENTITY_VALUE:
    pcVar23 = "HPP: internal error, state == ENTITY_VALUE\n";
    break;
  case XML_PARSER_ATTRIBUTE_VALUE:
    in_R8 = 0;
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"HPP: internal error, state == ATTRIBUTE_VALUE\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
    ctxt->instate = XML_PARSER_START_TAG;
    goto LAB_0014dcb6;
  case XML_PARSER_SYSTEM_LITERAL:
    pcVar23 = "HPP: internal error, state == XML_PARSER_SYSTEM_LITERAL\n";
    break;
  case XML_PARSER_EPILOG:
    if (pxVar26->buf == (xmlParserInputBufferPtr)0x0) {
      sVar15 = (size_t)pxVar26->length;
    }
    else {
      sVar15 = xmlBufUse(pxVar26->buf->buffer);
      pbVar16 = pxVar26->cur;
    }
    pxVar25 = pxVar26->base + (sVar15 - (long)pbVar16);
    pxVar22 = pxVar25;
    if (0 < (long)pxVar25) {
      pbVar16 = pxVar26->cur;
      bVar3 = *pbVar16;
      if (((ulong)bVar3 < 0x21) && ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
        bVar30 = false;
        htmlParseCharDataInternal(ctxt,0);
        goto LAB_0014e6aa;
      }
      pxVar22 = &DAT_00000001;
      if (pxVar25 != &DAT_00000001) {
        bVar29 = pbVar16[1];
        if (((bVar29 != 0x21 || bVar3 != 0x3c) || (pbVar16[2] != 0x2d)) || (pbVar16[3] != 0x2d)) {
          if ((bVar3 != 0x3c) || (bVar29 != 0x3f)) {
            if (3 < (long)pxVar25 || (bVar29 != 0x21 || bVar3 != 0x3c)) {
              ctxt->errNo = 5;
              ctxt->wellFormed = 0;
              ctxt->instate = XML_PARSER_EOF;
              if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                 (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
                (*p_Var9)(ctxt->userData);
              }
            }
            bVar30 = false;
            goto LAB_0014e6aa;
          }
          if ((terminate == 0) &&
             (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), iVar11 < 0))
          goto switchD_0014d96b_caseD_ffffffff;
          htmlParsePI(ctxt);
        }
        else {
          if ((terminate == 0) && (iVar11 = htmlParseLookupCommentEnd(ctxt), iVar11 < 0))
          goto switchD_0014d96b_caseD_ffffffff;
          htmlParseComment(ctxt);
        }
        ctxt->instate = XML_PARSER_EPILOG;
        goto LAB_0014dcc1;
      }
    }
    goto switchD_0014d96b_caseD_ffffffff;
  case XML_PARSER_IGNORE:
    pcVar23 = "HPP: internal error, state == XML_PARSER_IGNORE\n";
    break;
  case XML_PARSER_PUBLIC_LITERAL:
    pcVar23 = "HPP: internal error, state == XML_PARSER_LITERAL\n";
    break;
  case XML_PARSER_EOF:
    goto switchD_0014d96b_caseD_ffffffff;
  }
  in_R8 = 0;
  htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,pcVar23,(xmlChar *)0x0,(xmlChar *)0x0);
  ctxt->instate = XML_PARSER_CONTENT;
LAB_0014dcb6:
  ctxt->checkIndex = 0;
LAB_0014dcc1:
  pxVar26 = ctxt->input;
  pxVar22 = pxVar25;
  if (pxVar26 == (xmlParserInputPtr)0x0) goto switchD_0014d96b_caseD_ffffffff;
  goto LAB_0014d8f9;
switchD_0014d96b_caseD_ffffffff:
  bVar30 = pxVar22 == (xmlChar *)0x0;
LAB_0014e6aa:
  if (((terminate != 0) && (bVar30)) &&
     ((htmlAutoCloseOnEnd(ctxt), ctxt->nameNr == 0 && (ctxt->instate != XML_PARSER_EOF)))) {
    ctxt->instate = XML_PARSER_EOF;
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
      (*p_Var9)(ctxt->userData);
    }
  }
  if (((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
      ((terminate != 0 ||
       ((ctxt->instate == XML_PARSER_EPILOG || (ctxt->instate == XML_PARSER_EOF)))))) &&
     (pxVar21 = xmlGetIntSubset(ctxt->myDoc), pxVar21 == (xmlDtdPtr)0x0)) {
    pxVar21 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                 (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                 (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
    ctxt->myDoc->intSubset = pxVar21;
  }
LAB_0014e748:
  if (terminate != 0) {
    xVar12 = ctxt->instate;
    if (xVar12 != XML_PARSER_EOF) {
      if ((xVar12 != XML_PARSER_MISC) && (xVar12 != XML_PARSER_EPILOG)) {
        ctxt->errNo = 5;
        ctxt->wellFormed = 0;
      }
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
        (*p_Var9)(ctxt->userData);
      }
    }
    ctxt->instate = XML_PARSER_EOF;
  }
  return ctxt->errNo;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseChunk: context error\n", NULL, NULL);
	return(XML_ERR_INTERNAL_ERROR);
    }
    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->instate != XML_PARSER_EOF))  {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
	if (res < 0) {
	    ctxt->errNo = XML_PARSER_EOF;
	    ctxt->disableSAX = 1;
	    return (XML_PARSER_EOF);
	}
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "HPP: pushed %d\n", size);
#endif

#if 0
	if ((terminate) || (ctxt->input->buf->buffer->use > 80))
	    htmlParseTryOrFinish(ctxt, terminate);
#endif
    } else if (ctxt->instate != XML_PARSER_EOF) {
	if ((ctxt->input != NULL) && ctxt->input->buf != NULL) {
	    xmlParserInputBufferPtr in = ctxt->input->buf;
	    if ((in->encoder != NULL) && (in->buffer != NULL) &&
		    (in->raw != NULL)) {
		int nbchars;
		size_t base = xmlBufGetInputBase(in->buffer, ctxt->input);
		size_t current = ctxt->input->cur - ctxt->input->base;

		nbchars = xmlCharEncInput(in, terminate);
		xmlBufSetInputBaseCur(in->buffer, ctxt->input, base, current);
		if (nbchars < 0) {
		    htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
			         "encoder error\n", NULL, NULL);
		    return(XML_ERR_INVALID_ENCODING);
		}
	    }
	}
    }
    htmlParseTryOrFinish(ctxt, terminate);
    if (terminate) {
	if ((ctxt->instate != XML_PARSER_EOF) &&
	    (ctxt->instate != XML_PARSER_EPILOG) &&
	    (ctxt->instate != XML_PARSER_MISC)) {
	    ctxt->errNo = XML_ERR_DOCUMENT_END;
	    ctxt->wellFormed = 0;
	}
	if (ctxt->instate != XML_PARSER_EOF) {
	    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
		ctxt->sax->endDocument(ctxt->userData);
	}
	ctxt->instate = XML_PARSER_EOF;
    }
    return((xmlParserErrors) ctxt->errNo);
}